

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

bool __thiscall reflection::EnumVal::Verify(EnumVal *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  String *str;
  EnumVal *pEVar3;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec_00;
  Type *this_00;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if (*(ushort *)(this + -(long)*(int *)this) < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(this + (4 - (long)*(int *)this));
    }
    if (uVar2 == 0) {
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if (((bVar1) &&
        (bVar1 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,6,8), bVar1)) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10),
       bVar1)) {
      if (*(ushort *)(this + -(long)*(int *)this) < 0xb) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (10 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        this_00 = (Type *)0x0;
      }
      else {
        this_00 = (Type *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
      }
      if (((this_00 == (Type *)0x0) || (bVar1 = Type::Verify(this_00,verifier), bVar1)) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0xc),
         bVar1)) {
        if (*(ushort *)(this + -(long)*(int *)this) < 0xd) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(ushort *)(this + (0xc - (long)*(int *)this));
        }
        if (uVar2 == 0) {
          pEVar3 = (EnumVal *)0x0;
        }
        else {
          pEVar3 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
        }
        if ((pEVar3 != (EnumVal *)0x0) &&
           (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                              (verifier,(uint8_t *)pEVar3,4,(size_t *)0x0), !bVar1)) {
          return false;
        }
        if (*(ushort *)(this + -(long)*(int *)this) < 0xd) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(ushort *)(this + (0xc - (long)*(int *)this));
        }
        if (uVar2 == 0) {
          vec = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
        }
        else {
          vec = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
        }
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec);
        if ((bVar1) &&
           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0xe),
           bVar1)) {
          if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            pEVar3 = (EnumVal *)0x0;
          }
          else {
            pEVar3 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
          }
          if ((pEVar3 != (EnumVal *)0x0) &&
             (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (verifier,(uint8_t *)pEVar3,4,(size_t *)0x0), !bVar1)) {
            return false;
          }
          if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
          }
          else {
            vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                     (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
          }
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                            (verifier,vec_00);
          if (bVar1) {
            verifier->depth_ = verifier->depth_ - 1;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyField<int64_t>(verifier, VT_VALUE, 8) &&
           VerifyOffset(verifier, VT_UNION_TYPE) &&
           verifier.VerifyTable(union_type()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           verifier.EndTable();
  }